

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# db_test.cc
# Opt level: O3

void __thiscall leveldb::DBTest::DestroyAndReopen(DBTest *this,Options *options)

{
  AssertHelper *this_00;
  char *message;
  undefined1 local_a0 [16];
  _Alloc_hider local_90;
  undefined1 local_88 [96];
  
  if (this->db_ != (DB *)0x0) {
    (*this->db_->_vptr_DB[1])();
  }
  this->db_ = (DB *)0x0;
  Options::Options((Options *)local_88);
  DestroyDB((leveldb *)&local_90,&this->dbname_,(Options *)local_88);
  if (local_90._M_p != (pointer)0x0) {
    operator_delete__(local_90._M_p);
  }
  TryReopen((DBTest *)local_a0,(Options *)this);
  testing::internal::PredicateFormatterFromMatcher<leveldb::test::IsOKMatcher>::operator()
            ((PredicateFormatterFromMatcher<leveldb::test::IsOKMatcher> *)local_88,local_a0 + 8,
             (Status *)"TryReopen(options)");
  if ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_a0._0_8_ !=
      (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    operator_delete__((void *)local_a0._0_8_);
  }
  if (local_88[0] == (PredicateFormatterFromMatcher<leveldb::test::IsOKMatcher>)0x0) {
    testing::Message::Message((Message *)local_a0);
    if ((undefined8 *)local_88._8_8_ == (undefined8 *)0x0) {
      message = "";
    }
    else {
      message = *(char **)local_88._8_8_;
    }
    this_00 = (AssertHelper *)(local_a0 + 8);
    testing::internal::AssertHelper::AssertHelper
              (this_00,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/walterzhaoJR[P]leveldb/db/db_test.cc"
               ,299,message);
    testing::internal::AssertHelper::operator=(this_00,(Message *)local_a0);
    testing::internal::AssertHelper::~AssertHelper(this_00);
    if ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_a0._0_8_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(_func_int **)local_a0._0_8_ + 8))();
    }
  }
  if ((undefined8 *)local_88._8_8_ != (undefined8 *)0x0) {
    if (*(undefined8 **)local_88._8_8_ != (undefined8 *)(local_88._8_8_ + 0x10)) {
      operator_delete(*(undefined8 **)local_88._8_8_);
    }
    operator_delete((void *)local_88._8_8_);
  }
  return;
}

Assistant:

void DestroyAndReopen(Options* options = nullptr) {
    delete db_;
    db_ = nullptr;
    DestroyDB(dbname_, Options());
    ASSERT_LEVELDB_OK(TryReopen(options));
  }